

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O1

int mbedtls_ssl_write_handshake_msg_ext
              (mbedtls_ssl_context *ssl,int update_checksum,int force_flush)

{
  uint *puVar1;
  uchar uVar2;
  ushort uVar3;
  uint uVar4;
  size_t sVar5;
  mbedtls_ssl_flight_item *pmVar6;
  bool bVar7;
  int iVar8;
  mbedtls_ssl_flight_item *__ptr;
  uchar *puVar9;
  mbedtls_ssl_flight_item **ppmVar10;
  int line;
  mbedtls_ssl_flight_item *pmVar11;
  size_t sVar12;
  char *text;
  
  sVar5 = ssl->out_msglen;
  uVar2 = *ssl->out_msg;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
             ,0xae4,"=> write handshake message");
  uVar4 = ssl->out_msgtype;
  if ((uVar4 | 2) != 0x16) {
    iVar8 = 0xaeb;
LAB_00203e6c:
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
               ,iVar8,"should never happen");
    return -0x6c00;
  }
  if ((uVar4 != 0x16 || uVar2 != '\0') && (ssl->handshake == (mbedtls_ssl_handshake_params *)0x0)) {
    iVar8 = 0xaf4;
    goto LAB_00203e6c;
  }
  if ((ssl->conf->transport == '\x01') &&
     ((ssl->handshake != (mbedtls_ssl_handshake_params *)0x0 &&
      (ssl->handshake->retransmit_state == '\x01')))) {
    iVar8 = 0xafc;
    goto LAB_00203e6c;
  }
  if (0x400 < ssl->out_msglen) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
               ,0xb0e,"Record too large: size %zu, maximum %zu",ssl->out_msglen,0x400);
    return -0x6c00;
  }
  if (uVar4 == 0x16) {
    sVar12 = sVar5 - 4;
    ssl->out_msg[1] = (uchar)(sVar12 >> 0x10);
    ssl->out_msg[2] = (uchar)(sVar12 >> 8);
    ssl->out_msg[3] = (uchar)sVar12;
    if (ssl->conf->transport == '\x01') {
      if (ssl->out_msglen - 0x3f9 < 8) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                   ,0xb29,"DTLS handshake message too large: size %zu, maximum %zu",sVar12,0x3f4);
        return -0x7100;
      }
      memmove(ssl->out_msg + 0xc,ssl->out_msg + 4,sVar12);
      ssl->out_msglen = ssl->out_msglen + 8;
      if (uVar2 == '\0') {
        ssl->out_msg[4] = '\0';
        ssl->out_msg[5] = '\0';
      }
      else {
        uVar3 = (ushort)ssl->handshake->out_msg_seq;
        *(ushort *)(ssl->out_msg + 4) = uVar3 << 8 | uVar3 >> 8;
        puVar1 = &ssl->handshake->out_msg_seq;
        *puVar1 = *puVar1 + 1;
      }
      puVar9 = ssl->out_msg;
      puVar9[8] = '\0';
      puVar9[6] = '\0';
      puVar9[7] = '\0';
      puVar9 = ssl->out_msg;
      puVar9[0xb] = puVar9[3];
      *(undefined2 *)(puVar9 + 9) = *(undefined2 *)(puVar9 + 1);
    }
    if ((update_checksum != 0 && uVar2 != '\0') &&
       (iVar8 = (*ssl->handshake->update_checksum)(ssl,ssl->out_msg,ssl->out_msglen), iVar8 != 0)) {
      text = "update_checksum";
      line = 0xb45;
      goto LAB_00204159;
    }
  }
  if ((ssl->conf->transport != '\x01') || (ssl->out_msgtype == 0x16 && uVar2 == '\0')) {
    iVar8 = mbedtls_ssl_write_record(ssl,force_flush);
    if (iVar8 == 0) goto LAB_00204114;
    text = "ssl_write_record";
    line = 0xb58;
    goto LAB_00204159;
  }
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
             ,0x976,"=> ssl_flight_append");
  mbedtls_debug_print_buf
            (ssl,4,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
             ,0x978,"message appended to flight",ssl->out_msg,ssl->out_msglen);
  __ptr = (mbedtls_ssl_flight_item *)calloc(1,0x20);
  if (__ptr == (mbedtls_ssl_flight_item *)0x0) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
               ,0x97d,"alloc %zu bytes failed",0x20);
LAB_002040d6:
    bVar7 = false;
    iVar8 = -0x7f00;
  }
  else {
    sVar12 = ssl->out_msglen;
    puVar9 = (uchar *)calloc(1,sVar12);
    __ptr->p = puVar9;
    if (puVar9 == (uchar *)0x0) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                 ,0x983,"alloc %zu bytes failed",sVar12);
      free(__ptr);
      goto LAB_002040d6;
    }
    memcpy(puVar9,ssl->out_msg,sVar12);
    __ptr->len = sVar12;
    __ptr->type = (uchar)ssl->out_msgtype;
    __ptr->next = (mbedtls_ssl_flight_item *)0x0;
    pmVar6 = ssl->handshake->flight;
    if (pmVar6 == (mbedtls_ssl_flight_item *)0x0) {
      ppmVar10 = &ssl->handshake->flight;
    }
    else {
      do {
        pmVar11 = pmVar6;
        pmVar6 = pmVar11->next;
      } while (pmVar6 != (mbedtls_ssl_flight_item *)0x0);
      ppmVar10 = &pmVar11->next;
    }
    *ppmVar10 = __ptr;
    iVar8 = 0;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
               ,0x999,"<= ssl_flight_append");
    bVar7 = true;
  }
  if (bVar7) {
LAB_00204114:
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
               ,0xb5d,"<= write handshake message");
    return 0;
  }
  text = "ssl_flight_append";
  line = 0xb51;
LAB_00204159:
  mbedtls_debug_print_ret
            (ssl,1,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
             ,line,text,iVar8);
  return iVar8;
}

Assistant:

int mbedtls_ssl_write_handshake_msg_ext(mbedtls_ssl_context *ssl,
                                        int update_checksum,
                                        int force_flush)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    const size_t hs_len = ssl->out_msglen - 4;
    const unsigned char hs_type = ssl->out_msg[0];

    MBEDTLS_SSL_DEBUG_MSG(2, ("=> write handshake message"));

    /*
     * Sanity checks
     */
    if (ssl->out_msgtype != MBEDTLS_SSL_MSG_HANDSHAKE          &&
        ssl->out_msgtype != MBEDTLS_SSL_MSG_CHANGE_CIPHER_SPEC) {
        MBEDTLS_SSL_DEBUG_MSG(1, ("should never happen"));
        return MBEDTLS_ERR_SSL_INTERNAL_ERROR;
    }

    /* Whenever we send anything different from a
     * HelloRequest we should be in a handshake - double check. */
    if (!(ssl->out_msgtype == MBEDTLS_SSL_MSG_HANDSHAKE &&
          hs_type          == MBEDTLS_SSL_HS_HELLO_REQUEST) &&
        ssl->handshake == NULL) {
        MBEDTLS_SSL_DEBUG_MSG(1, ("should never happen"));
        return MBEDTLS_ERR_SSL_INTERNAL_ERROR;
    }

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if (ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
        ssl->handshake != NULL &&
        ssl->handshake->retransmit_state == MBEDTLS_SSL_RETRANS_SENDING) {
        MBEDTLS_SSL_DEBUG_MSG(1, ("should never happen"));
        return MBEDTLS_ERR_SSL_INTERNAL_ERROR;
    }
#endif

    /* Double-check that we did not exceed the bounds
     * of the outgoing record buffer.
     * This should never fail as the various message
     * writing functions must obey the bounds of the
     * outgoing record buffer, but better be safe.
     *
     * Note: We deliberately do not check for the MTU or MFL here.
     */
    if (ssl->out_msglen > MBEDTLS_SSL_OUT_CONTENT_LEN) {
        MBEDTLS_SSL_DEBUG_MSG(1, ("Record too large: "
                                  "size %" MBEDTLS_PRINTF_SIZET
                                  ", maximum %" MBEDTLS_PRINTF_SIZET,
                                  ssl->out_msglen,
                                  (size_t) MBEDTLS_SSL_OUT_CONTENT_LEN));
        return MBEDTLS_ERR_SSL_INTERNAL_ERROR;
    }

    /*
     * Fill handshake headers
     */
    if (ssl->out_msgtype == MBEDTLS_SSL_MSG_HANDSHAKE) {
        ssl->out_msg[1] = MBEDTLS_BYTE_2(hs_len);
        ssl->out_msg[2] = MBEDTLS_BYTE_1(hs_len);
        ssl->out_msg[3] = MBEDTLS_BYTE_0(hs_len);

        /*
         * DTLS has additional fields in the Handshake layer,
         * between the length field and the actual payload:
         *      uint16 message_seq;
         *      uint24 fragment_offset;
         *      uint24 fragment_length;
         */
#if defined(MBEDTLS_SSL_PROTO_DTLS)
        if (ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM) {
            /* Make room for the additional DTLS fields */
            if (MBEDTLS_SSL_OUT_CONTENT_LEN - ssl->out_msglen < 8) {
                MBEDTLS_SSL_DEBUG_MSG(1, ("DTLS handshake message too large: "
                                          "size %" MBEDTLS_PRINTF_SIZET ", maximum %"
                                          MBEDTLS_PRINTF_SIZET,
                                          hs_len,
                                          (size_t) (MBEDTLS_SSL_OUT_CONTENT_LEN - 12)));
                return MBEDTLS_ERR_SSL_BAD_INPUT_DATA;
            }

            memmove(ssl->out_msg + 12, ssl->out_msg + 4, hs_len);
            ssl->out_msglen += 8;

            /* Write message_seq and update it, except for HelloRequest */
            if (hs_type != MBEDTLS_SSL_HS_HELLO_REQUEST) {
                MBEDTLS_PUT_UINT16_BE(ssl->handshake->out_msg_seq, ssl->out_msg, 4);
                ++(ssl->handshake->out_msg_seq);
            } else {
                ssl->out_msg[4] = 0;
                ssl->out_msg[5] = 0;
            }

            /* Handshake hashes are computed without fragmentation,
             * so set frag_offset = 0 and frag_len = hs_len for now */
            memset(ssl->out_msg + 6, 0x00, 3);
            memcpy(ssl->out_msg + 9, ssl->out_msg + 1, 3);
        }
#endif /* MBEDTLS_SSL_PROTO_DTLS */

        /* Update running hashes of handshake messages seen */
        if (hs_type != MBEDTLS_SSL_HS_HELLO_REQUEST && update_checksum != 0) {
            ret = ssl->handshake->update_checksum(ssl, ssl->out_msg,
                                                  ssl->out_msglen);
            if (ret != 0) {
                MBEDTLS_SSL_DEBUG_RET(1, "update_checksum", ret);
                return ret;
            }
        }
    }

    /* Either send now, or just save to be sent (and resent) later */
#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if (ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
        !(ssl->out_msgtype == MBEDTLS_SSL_MSG_HANDSHAKE &&
          hs_type          == MBEDTLS_SSL_HS_HELLO_REQUEST)) {
        if ((ret = ssl_flight_append(ssl)) != 0) {
            MBEDTLS_SSL_DEBUG_RET(1, "ssl_flight_append", ret);
            return ret;
        }
    } else
#endif
    {
        if ((ret = mbedtls_ssl_write_record(ssl, force_flush)) != 0) {
            MBEDTLS_SSL_DEBUG_RET(1, "ssl_write_record", ret);
            return ret;
        }
    }

    MBEDTLS_SSL_DEBUG_MSG(2, ("<= write handshake message"));

    return 0;
}